

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_proto3.pb.cc
# Opt level: O0

size_t __thiscall proto3_unittest::TestOneof2::ByteSizeLong(TestOneof2 *this)

{
  FooCase FVar1;
  TestOneof2_NestedEnum value;
  size_t sVar2;
  size_t sStack_20;
  uint32_t cached_has_bits;
  size_t total_size;
  TestOneof2 *this_;
  TestOneof2 *this_local;
  
  sStack_20 = 0;
  FVar1 = foo_case(this);
  if ((FVar1 != FOO_NOT_SET) && (FVar1 == kFooEnum)) {
    value = _internal_foo_enum(this);
    sStack_20 = google::protobuf::internal::WireFormatLite::EnumSize(value);
    sStack_20 = sStack_20 + 1;
  }
  sVar2 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_20,&(this->field_0)._impl_._cached_size_);
  return sVar2;
}

Assistant:

::size_t TestOneof2::ByteSizeLong() const {
  const TestOneof2& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto3_unittest.TestOneof2)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  switch (this_.foo_case()) {
    // .proto3_unittest.TestOneof2.NestedEnum foo_enum = 6;
    case kFooEnum: {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_foo_enum());
      break;
    }
    case FOO_NOT_SET: {
      break;
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}